

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall leveldb::anon_unknown_1::PosixEnv::UnlockFile(PosixEnv *this,FileLock *lock)

{
  int iVar1;
  string *psVar2;
  int *piVar3;
  PosixFileLock *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  PosixFileLock *local_28;
  PosixFileLock *posix_file_lock;
  FileLock *lock_local;
  PosixEnv *this_local;
  
  local_28 = in_RDX;
  lock_local = lock;
  this_local = this;
  iVar1 = PosixFileLock::fd(in_RDX);
  iVar1 = LockOrUnlock(iVar1,false);
  if (iVar1 == -1) {
    psVar2 = (anonymous_namespace)::PosixFileLock::filename_abi_cxx11_((PosixFileLock *)local_28);
    std::operator+(&local_48,"unlock ",psVar2);
    piVar3 = __errno_location();
    PosixError((anon_unknown_1 *)this,&local_48,*piVar3);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    psVar2 = (anonymous_namespace)::PosixFileLock::filename_abi_cxx11_((PosixFileLock *)local_28);
    PosixLockTable::Remove((PosixLockTable *)(lock + 0x18),psVar2);
    iVar1 = PosixFileLock::fd(local_28);
    close(iVar1);
    if (local_28 != (PosixFileLock *)0x0) {
      (*(local_28->super_FileLock)._vptr_FileLock[1])();
    }
    Status::OK();
  }
  return (Status)(char *)this;
}

Assistant:

Status UnlockFile(FileLock* lock) override {
    PosixFileLock* posix_file_lock = static_cast<PosixFileLock*>(lock);
    if (LockOrUnlock(posix_file_lock->fd(), false) == -1) {
      return PosixError("unlock " + posix_file_lock->filename(), errno);
    }
    locks_.Remove(posix_file_lock->filename());
    ::close(posix_file_lock->fd());
    delete posix_file_lock;
    return Status::OK();
  }